

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

HighsInt __thiscall HFactor::buildKernel(HFactor *this)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer pcVar4;
  HFactor *pHVar5;
  HighsInt k;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint *puVar9;
  pointer piVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  pointer piVar15;
  HighsInt i;
  HighsInt HVar16;
  long lVar17;
  pointer piVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  HighsInt my_k;
  bool bVar29;
  double extraout_XMM0_Qa;
  double dVar30;
  ulong extraout_XMM0_Qb;
  double dVar31;
  double dVar32;
  HighsInt iRowPivot;
  ulong local_1a8;
  HighsInt iRow;
  HFactor *local_198;
  pointer local_190;
  long local_188;
  pointer local_180;
  uint local_174;
  pointer local_170;
  double local_168;
  pointer local_160;
  vector<double,_std::allocator<double>_> *local_158;
  vector<int,_std::allocator<int>_> *local_150;
  double value;
  int local_13c;
  double local_138;
  ulong local_130;
  pointer local_128;
  ulong local_120;
  pointer local_118;
  ulong local_110;
  pointer local_108;
  ulong uStack_100;
  double local_f0;
  double local_e8;
  long local_e0;
  pointer local_d8;
  double pivot_multiplier;
  double local_c8;
  HighsLogOptions *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  vector<signed_char,_std::allocator<signed_char>_> *local_90;
  vector<int,_std::allocator<int>_> *local_88;
  vector<int,_std::allocator<int>_> *local_80;
  double local_78;
  double local_70;
  double local_68;
  size_type local_60;
  long local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_68 = this->time_limit_;
  local_150 = &this->mc_index;
  local_b8 = &this->mr_index;
  local_158 = &this->mc_value;
  local_80 = &(this->refactor_info_).pivot_row;
  local_88 = &(this->refactor_info_).pivot_var;
  local_90 = &(this->refactor_info_).pivot_type;
  local_38 = &this->l_index;
  local_40 = &this->l_value;
  local_98 = &this->l_start;
  local_48 = &this->u_index;
  local_50 = &this->u_value;
  local_a0 = &this->u_pivot_index;
  local_a8 = &this->u_pivot_value;
  local_b0 = &this->u_start;
  local_138 = 0.0;
  local_c8 = 0.0;
  local_f0 = 0.0;
  local_168 = 0.0;
  local_c0 = &this->log_options;
  local_13c = 100;
  local_130 = 0;
  piVar10 = (pointer)0.0;
  local_198 = this;
  do {
    iVar23 = local_13c;
    iVar7 = this->nwork;
    uVar11 = iVar7 - 1;
    this->nwork = uVar11;
    if (iVar7 < 1) {
      this->build_synthetic_tick =
           local_f0 * 80.0 + (double)piVar10 * 20.0 + local_168 * 160.0 + this->build_synthetic_tick
      ;
      this->rank_deficiency = 0;
      return 0;
    }
    local_190 = piVar10;
    if ((local_68 != INFINITY) &&
       (uVar21 = (long)((ulong)(uint)((int)local_130 >> 0x1f) << 0x20 | local_130 & 0xffffffff) %
                 (long)local_13c, (int)uVar21 == 0)) {
      HighsTimer::read(this->build_timer_,0,(void *)(uVar21 & 0xffffffff),(ulong)uVar11);
      dVar30 = this->time_limit_;
      local_13c = iVar23;
      if (dVar30 / 1000.0 < extraout_XMM0_Qa - local_c8) {
        local_13c = iVar23 / 10;
        if (iVar23 / 10 < 2) {
          local_13c = 1;
        }
      }
      if (dVar30 < extraout_XMM0_Qa) {
        return -1;
      }
      local_138 = local_138 * 0.9 + ((extraout_XMM0_Qa - local_c8) / (double)iVar23) * 0.1;
      if (dVar30 < (double)((this->kernel_dim - (int)local_130) + 1) * local_138 + extraout_XMM0_Qa)
      {
        return -1;
      }
      uVar11 = this->nwork;
      local_c8 = extraout_XMM0_Qa;
    }
    pHVar5 = local_198;
    iRowPivot = -1;
    uVar6 = 8;
    if ((int)uVar11 < 8) {
      uVar6 = uVar11;
    }
    local_188 = CONCAT44(local_188._4_4_,uVar6);
    piVar10 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar21 = (ulong)piVar10[1];
    if (uVar21 == 0xffffffffffffffff) {
      local_128 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1a8 = (ulong)local_128[1];
      local_118 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      piVar18 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar29 = local_1a8 == 0xffffffffffffffff;
      if (bVar29) {
        local_1a8 = 0xffffffff;
        uVar21 = 0xffffffff;
      }
      else {
        uVar21 = (ulong)(uint)piVar18[local_118[local_1a8]];
        iRowPivot = local_128[1];
      }
      bVar29 = !bVar29;
      this = local_198;
    }
    else {
      iRowPivot = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar21]];
      local_1a8 = (ulong)(uint)iRowPivot;
      local_128 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_118 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      piVar18 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar29 = true;
    }
    iVar7 = this->num_basic;
    local_e0 = (long)iVar7;
    iVar23 = this->num_row;
    local_e8 = (double)(long)iVar23;
    dVar30 = (double)iVar23 * (double)iVar7;
    local_130 = (ulong)((int)local_130 + 1);
    if (iVar7 < iVar23) {
      iVar7 = iVar23;
    }
    local_170 = (this->mc_min_pivot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_180 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    piVar15 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar2 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_108 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_d8 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_160 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_120 = (ulong)iVar7;
    uVar22 = 0;
    dVar31 = dVar30;
    for (lVar24 = 2; (!bVar29 && (lVar24 <= (long)local_120)); lVar24 = lVar24 + 1) {
      iVar7 = (int)lVar24;
      if (lVar24 <= (long)local_e8) {
        puVar9 = (uint *)(piVar10 + lVar24);
        while( true ) {
          lVar13 = (long)(int)*puVar9;
          if (lVar13 == -1) break;
          lVar8 = (long)local_180[lVar13];
          lVar17 = piVar15[lVar13] + lVar8;
          bVar25 = bVar29;
          for (; lVar8 < lVar17; lVar8 = lVar8 + 1) {
            if (local_170[lVar13] <= ABS(pdVar2[lVar8])) {
              iVar23 = piVar3[lVar8];
              dVar32 = (double)(local_108[iVar23] + -1) * (double)(iVar7 + -1);
              if (dVar32 < dVar31) {
                bVar25 = (bool)(bVar25 | local_108[iVar23] < lVar24);
                uVar21 = (ulong)*puVar9;
                dVar31 = dVar32;
                iRowPivot = iVar23;
                local_1a8 = (long)iVar23;
              }
            }
          }
          uVar26 = (int)uVar22 + 1;
          bVar29 = bVar25;
          if (dVar31 < dVar30) {
            bVar29 = true;
          }
          if ((int)uVar22 < (int)uVar6) {
            bVar29 = bVar25;
          }
          if (bVar29) {
            uVar22 = (ulong)uVar26;
            break;
          }
          local_190 = (pointer)((double)local_190 + (double)iVar7);
          puVar9 = (uint *)(local_d8 + lVar13);
          uVar22 = (ulong)uVar26;
        }
      }
      if (lVar24 <= local_e0) {
        puVar9 = (uint *)(local_128 + lVar24);
        while( true ) {
          uVar26 = *puVar9;
          lVar13 = (long)(int)uVar26;
          if (lVar13 == -1) break;
          lVar8 = (long)local_118[lVar13];
          lVar17 = local_108[lVar13] + lVar8;
          bVar25 = bVar29;
          for (; lVar8 < lVar17; lVar8 = lVar8 + 1) {
            uVar19 = piVar18[lVar8];
            iVar23 = piVar15[(int)uVar19];
            dVar32 = (double)(iVar23 + -1) * (double)(iVar7 + -1);
            if (dVar31 <= dVar32) {
LAB_00354edc:
              uVar19 = (uint)uVar21;
            }
            else {
              lVar27 = (long)local_180[(int)uVar19] << 2;
              do {
                lVar28 = lVar27 + 4;
                puVar9 = (uint *)((long)piVar3 + lVar27);
                lVar27 = lVar28;
              } while (*puVar9 != uVar26);
              if (ABS(*(double *)((long)pdVar2 + lVar28 * 2 + -8)) < local_170[(int)uVar19])
              goto LAB_00354edc;
              bVar25 = (bool)(bVar25 | iVar23 <= lVar24);
              local_1a8 = (ulong)uVar26;
              dVar31 = dVar32;
              iRowPivot = uVar26;
            }
            uVar21 = (ulong)uVar19;
          }
          uVar26 = (int)uVar22 + 1;
          bVar29 = bVar25;
          if (dVar31 < dVar30) {
            bVar29 = true;
          }
          if ((int)uVar22 < (int)uVar6) {
            bVar29 = bVar25;
          }
          local_110 = uVar22;
          if (bVar29) {
            uVar22 = (ulong)uVar26;
            break;
          }
          puVar9 = (uint *)(local_160 + lVar13);
          uVar22 = (ulong)uVar26;
        }
        local_190 = (pointer)((double)local_190 + (double)iVar7);
      }
    }
    local_174 = uVar11;
    if ((int)local_1a8 < 0) {
      local_198->rank_deficiency = uVar11 + 1;
      local_190 = piVar10;
      highsLogDev(local_c0,kWarning,"Factorization identifies rank deficiency of %d\n");
      return pHVar5->rank_deficiency;
    }
    iVar7 = (int)uVar21;
    pivot_multiplier = colDelete(local_198,iVar7,(int)local_1a8);
    rowDelete(pHVar5,iVar7,iRowPivot);
    clinkDel(pHVar5,iVar7);
    rlinkDel(pHVar5,iRowPivot);
    if (pHVar5->pivot_tolerance <= ABS(pivot_multiplier)) {
      (pHVar5->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[iVar7] = iRowPivot;
      std::vector<int,_std::allocator<int>_>::push_back(local_80,&iRowPivot);
      std::vector<int,_std::allocator<int>_>::push_back(local_88,pHVar5->basic_index + iVar7);
      std::vector<signed_char,_std::allocator<signed_char>_>::push_back
                (local_90,"\x04buildRankDeficiency0:");
      piVar10 = (pointer)(long)(pHVar5->mc_start).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iVar7];
      local_110 = (long)(pHVar5->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar7] + (long)piVar10;
      local_160 = piVar10;
      for (uVar21 = 0; this = local_198, (long)((long)local_160 + uVar21) < (long)local_110;
          uVar21 = uVar21 + 1) {
        iRow = (local_198->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(long)piVar10 + uVar21];
        value = (local_198->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar10 + uVar21] / pivot_multiplier;
        (local_198->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar21] = iRow;
        (local_198->mwz_column_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iRow] = value;
        (local_198->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[iRow] = '\x01';
        std::vector<int,_std::allocator<int>_>::push_back(local_38,&iRow);
        std::vector<double,_std::allocator<double>_>::push_back(local_40,&value);
        (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iRow] =
             (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iRow];
        rowDelete(this,iVar7,iRow);
      }
      value = (double)CONCAT44(value._4_4_,
                               (int)((ulong)((long)(local_198->l_index).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(local_198->l_index).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
      local_120 = uVar21;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_98,(int *)&value);
      local_70 = (double)((this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar7] * 2);
      lVar8 = (long)(this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar7] + (long)local_160;
      iVar7 = (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      lVar17 = (long)((int)lVar8 - iVar7);
      lVar24 = lVar17 * 4;
      lVar13 = lVar17 * 8;
      for (; lVar17 < lVar8; lVar17 = lVar17 + 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (local_48,(value_type_conflict2 *)
                            ((long)(local_150->super__Vector_base<int,_std::allocator<int>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar24));
        std::vector<double,_std::allocator<double>_>::push_back
                  (local_50,(value_type_conflict1 *)
                            ((long)(local_158->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar13));
        lVar24 = lVar24 + 4;
        lVar13 = lVar13 + 8;
      }
      std::vector<int,_std::allocator<int>_>::push_back(local_a0,&iRowPivot);
      std::vector<double,_std::allocator<double>_>::push_back(local_a8,&pivot_multiplier);
      value = (double)CONCAT44(value._4_4_,
                               (int)((ulong)((long)(this->u_index).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->u_index).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_b0,(int *)&value);
      local_78 = (double)iVar7;
      piVar10 = (pointer)(long)(this->mr_start).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start[iRowPivot];
      local_e0 = (long)(this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iRowPivot] + (long)piVar10;
      local_e8 = (double)(int)local_120;
      local_180 = (pointer)(local_120 & 0xffffffff);
      while (uVar21 = local_120, (long)piVar10 < local_e0) {
        iVar7 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar10];
        local_170 = (pointer)CONCAT44(local_170._4_4_,iVar7);
        lVar24 = (long)iVar7;
        uVar11 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar24];
        local_d8 = (pointer)(ulong)uVar11;
        iVar23 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar24];
        local_118 = piVar10;
        local_108 = (pointer)colDelete(this,iVar7,iRowPivot);
        local_188 = lVar24;
        uStack_100 = extraout_XMM0_Qb;
        colStoreN(this,iVar7,iRowPivot,(double)local_108);
        piVar10 = local_180;
        local_108 = (pointer)-(double)local_108;
        uStack_100 = uStack_100 ^ 0x8000000000000000;
        lVar13 = (long)(int)((uVar11 - 1) + iVar23);
        iVar7 = 0;
        lVar8 = (long)iVar23;
        for (lVar24 = lVar8; lVar24 < lVar13; lVar24 = lVar24 + 1) {
          pcVar4 = (this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar20 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar24];
          if (pcVar4[iVar20] != '\0') {
            dVar30 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24];
            pcVar4[iVar20] = '\0';
            dVar30 = (this->mwz_column_array).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar20] * (double)local_108 + dVar30;
            dVar32 = ABS(dVar30);
            dVar31 = 0.0;
            if (1e-14 <= dVar32) {
              dVar31 = dVar30;
            }
            uVar21 = (ulong)((int)uVar21 - 1);
            iVar7 = iVar7 + (uint)(dVar32 < 1e-14);
            (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar24] = dVar31;
          }
        }
        iVar20 = iVar23;
        local_1a8 = uVar21;
        if (0 < iVar7) {
          for (; lVar8 < lVar13; lVar8 = lVar8 + 1) {
            pdVar2 = (local_158->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar30 = pdVar2[lVar8];
            piVar18 = (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            HVar16 = piVar18[lVar8];
            if ((dVar30 != 0.0) || (NAN(dVar30))) {
              piVar18[iVar20] = HVar16;
              pdVar2[iVar20] = dVar30;
              iVar20 = iVar20 + 1;
            }
            else {
              rowDelete(this,(HighsInt)local_170,HVar16);
            }
          }
          (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[local_188] = iVar20 - iVar23;
        }
        lVar24 = local_188;
        pHVar5 = local_198;
        if (0 < (int)local_1a8) {
          piVar18 = (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar7 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_188];
          iVar23 = piVar18[local_188];
          piVar15 = (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar20 = piVar15[local_188];
          if (iVar20 < iVar7 + (int)local_1a8 + iVar23) {
            local_128 = (pointer)CONCAT44(local_128._4_4_,iVar23);
            piVar10 = (local_198->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_174 = piVar10[local_188];
            lVar13 = (long)(int)local_174;
            iVar7 = iVar7 + local_174;
            iVar23 = (int)local_1a8;
            if ((int)local_1a8 < iVar20) {
              iVar23 = iVar20;
            }
            piVar15[local_188] = iVar23 + iVar20;
            iVar23 = (int)((ulong)((long)(local_198->mc_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)(local_198->mc_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) >> 2);
            piVar10[local_188] = iVar23;
            lVar8 = (long)iVar23;
            local_60 = piVar15[local_188] + lVar8;
            local_58 = (long)piVar18[local_188];
            std::vector<int,_std::allocator<int>_>::resize(local_150,local_60);
            std::vector<double,_std::allocator<double>_>::resize
                      (local_158,
                       (pHVar5->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar24] + lVar8);
            lVar24 = (long)iVar7;
            sVar14 = lVar24 * 4 + lVar13 * -4;
            if (sVar14 != 0) {
              piVar10 = (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              memmove(piVar10 + lVar8,piVar10 + lVar13,sVar14);
            }
            sVar14 = lVar24 * 8 + lVar13 * -8;
            if (sVar14 != 0) {
              pdVar2 = (local_158->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              memmove(pdVar2 + lVar8,pdVar2 + lVar13,sVar14);
            }
            piVar10 = local_180;
            iVar20 = iVar20 + local_174;
            lVar24 = (int)local_60 - local_58;
            lVar13 = (long)(iVar20 - (int)local_128);
            sVar14 = (long)iVar20 * 4 + lVar13 * -4;
            if (sVar14 != 0) {
              piVar18 = (local_150->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              memmove(piVar18 + lVar24,piVar18 + lVar13,sVar14);
            }
            sVar14 = (long)iVar20 * 8 + lVar13 * -8;
            if (sVar14 != 0) {
              pdVar2 = (local_158->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              memmove(pdVar2 + lVar24,pdVar2 + lVar13,sVar14);
            }
          }
          this = local_198;
          for (piVar18 = (pointer)0x0; piVar18 < piVar10; piVar18 = (pointer)((long)piVar18 + 1)) {
            iVar7 = (this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)piVar18];
            if ((this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7] != '\0') {
              colInsert(this,(HighsInt)local_170,iVar7,
                        (this->mwz_column_array).super__Vector_base<double,_std::allocator<double>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar7] * (double)local_108);
            }
          }
          for (piVar18 = (pointer)0x0; piVar18 < piVar10; piVar18 = (pointer)((long)piVar18 + 1)) {
            iVar7 = (this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(long)piVar18];
            if ((this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7] != '\0') {
              piVar10 = (this->mr_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar23 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar7];
              if (iVar23 == piVar10[iVar7]) {
                piVar15 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar20 = piVar15[iVar7];
                uVar21 = (long)(this->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->mr_index).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                iVar12 = (int)(uVar21 >> 2);
                piVar15[iVar7] = iVar12;
                iVar1 = piVar10[iVar7];
                piVar10[iVar7] = iVar1 * 2;
                std::vector<int,_std::allocator<int>_>::resize
                          (local_b8,(long)iVar12 + (long)iVar1 * 2);
                sVar14 = (long)iVar23 * 4;
                if (sVar14 != 0) {
                  piVar10 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  memmove((void *)(((long)(uVar21 * 0x40000000) >> 0x1e) + (long)piVar10),
                          piVar10 + iVar20,sVar14);
                }
              }
              rowInsert(this,(HighsInt)local_170,iVar7);
              piVar10 = local_180;
            }
          }
        }
        lVar24 = local_188;
        local_f0 = (double)((int)local_1a8 * 2) + local_f0 + local_e8;
        for (piVar18 = (pointer)0x0; piVar18 < piVar10; piVar18 = (pointer)((long)piVar18 + 1)) {
          (this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start
          [(this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)piVar18]] = '\x01';
        }
        HVar16 = (HighsInt)local_188;
        colFixMax(this,HVar16);
        if ((int)local_d8 !=
            (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar24]) {
          clinkDel(this,HVar16);
          clinkAdd(this,HVar16,
                   (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar24]);
        }
        piVar10 = (pointer)((long)local_118 + 1);
      }
      local_168 = local_168 + local_70;
      for (piVar18 = (pointer)0x0; piVar15 = local_160, piVar10 = local_190, piVar18 < local_180;
          piVar18 = (pointer)((long)piVar18 + 1)) {
        (this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start
        [(this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[(long)piVar18]] = '\0';
      }
      for (; (long)piVar15 < (long)local_110; piVar15 = (pointer)((long)piVar15 + 1)) {
        iVar7 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar15];
        if ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7] !=
            (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7]) {
          rlinkDel(this,iVar7);
          rlinkAdd(this,iVar7,
                   (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar7]);
          piVar10 = local_190;
        }
      }
      local_168 = local_168 + local_78;
    }
    else {
      highsLogDev(local_c0,kWarning,"Defer singular pivot = %11.4g\n");
      if ((pHVar5->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iRowPivot] == 0) {
        clinkAdd(pHVar5,iVar7,
                 (pHVar5->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar7]);
      }
      else {
        zeroCol(pHVar5,iVar7);
        rlinkAdd(pHVar5,iRowPivot,
                 (pHVar5->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iRowPivot]);
      }
      pHVar5->nwork = pHVar5->nwork + 1;
      this = pHVar5;
      piVar10 = local_190;
    }
  } while( true );
}

Assistant:

HighsInt HFactor::buildKernel() {
  // Deal with the kernel part by 'n-work' pivoting

  double fake_search = 0;
  double fake_fill = 0;
  double fake_eliminate = 0;

  const bool progress_report = false;  // num_basic != num_row;
  const HighsInt progress_frequency = 10000;
  // Initial timer frequency: may be reduced if iterations get slow
  HighsInt timer_frequency = 100;
  double previous_iteration_time = 0;
  double average_iteration_time = 0;
  const bool check_for_timeout = this->time_limit_ < kHighsInf;
  HighsInt search_k = 0;

  const HighsInt check_nwork = -11;
  while (nwork-- > 0) {
    //    printf("\nnwork = %d\n", (int)nwork);
    if (nwork == check_nwork) {
      reportAsm();
    }
    // Determine whether to return due to exceeding the time limit
    if (check_for_timeout && search_k % timer_frequency == 0) {
      double current_time = build_timer_->read();
      double time_difference = current_time - previous_iteration_time;
      previous_iteration_time = current_time;
      double iteration_time = time_difference / (1.0 * timer_frequency);
      average_iteration_time =
          0.9 * average_iteration_time + 0.1 * iteration_time;

      if (time_difference > this->time_limit_ / 1e3)
        timer_frequency = std::max(HighsInt(1), timer_frequency / 10);
      HighsInt iterations_left = kernel_dim - search_k + 1;
      double remaining_time_bound = average_iteration_time * iterations_left;
      double total_time_bound = current_time + remaining_time_bound;
      if (current_time > this->time_limit_ ||
          total_time_bound > this->time_limit_)
        return kBuildKernelReturnTimeout;
    }

    /**
     * 1. Search for the pivot
     */
    HighsInt jColPivot = -1;
    HighsInt iRowPivot = -1;
    //    int8_t pivot_type = kPivotIllegal;
    // 1.1. Setup search merits
    HighsInt searchLimit = min(nwork, HighsInt{8});
    HighsInt searchCount = 0;

    double merit_limit = 1.0 * num_basic * num_row;
    double merit_pivot = merit_limit;

    if (progress_report && search_k) {
      if (search_k % progress_frequency == 0) {
        HighsInt min_col_count = kHighsIInf;
        HighsInt min_row_count = kHighsIInf;
        for (HighsInt count = 1; count < num_row; count++) {
          if (col_link_first[count] >= 0) {
            min_col_count = count;
            break;
          }
        }
        for (HighsInt count = 1; count < num_basic; count++) {
          if (row_link_first[count] >= 0) {
            min_row_count = count;
            break;
          }
        }
        printf(
            "HFactor::buildKernel stage = %6d: min_col_count = %3d; "
            "min_row_count = %3d\n",
            (int)search_k, (int)min_col_count, (int)min_row_count);
      }
    }
    search_k++;
    // 1.2. Search for local singletons
    bool foundPivot = false;
    //    jColPivot = col_link_first[1];
    if (!foundPivot && col_link_first[1] != -1) {
      // Not yet found a pivot and there is at least one column
      // singleton
      jColPivot = col_link_first[1];
      iRowPivot = mc_index[mc_start[jColPivot]];
      foundPivot = true;
    }
    if (!foundPivot && row_link_first[1] != -1) {
      iRowPivot = row_link_first[1];
      jColPivot = mr_index[mr_start[iRowPivot]];
      foundPivot = true;
    }
    const bool singleton_pivot = foundPivot;
#ifndef NDEBUG
    double candidate_pivot_value = 0;
#endif
    // 1.3. Major search loop
    //
    // Row count can be more than the number of rows if num_basic >
    // num_row
    const HighsInt max_count = max(num_row, num_basic);
    for (HighsInt count = 2; !foundPivot && count <= max_count; count++) {
      // Column count cannot exceed the number of rows
      if (count <= num_row) {
        // 1.3.1 Search for columns
        for (HighsInt j = col_link_first[count]; j != -1;
             j = col_link_next[j]) {
          double min_pivot = mc_min_pivot[j];
          HighsInt start = mc_start[j];
          HighsInt end = start + mc_count_a[j];
          for (HighsInt k = start; k < end; k++) {
            if (fabs(mc_value[k]) >= min_pivot) {
              HighsInt i = mc_index[k];
              HighsInt row_count = mr_count[i];
              double merit_local = 1.0 * (count - 1) * (row_count - 1);
              if (merit_pivot > merit_local) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[k]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (row_count < count);
              }
            }
          }

          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;

          fake_search += count;
        }
      }

      // Row count cannot exceed the number of basic variables
      if (count <= num_basic) {
        // 1.3.2 Search for rows
        for (HighsInt i = row_link_first[count]; i != -1;
             i = row_link_next[i]) {
          HighsInt start = mr_start[i];
          HighsInt end = start + mr_count[i];
          for (HighsInt k = start; k < end; k++) {
            HighsInt j = mr_index[k];
            HighsInt column_count = mc_count_a[j];
            double merit_local = 1.0 * (count - 1) * (column_count - 1);
            if (merit_local < merit_pivot) {
              HighsInt ifind = mc_start[j];
              while (mc_index[ifind] != i) ifind++;
              if (fabs(mc_value[ifind]) >= mc_min_pivot[j]) {
#ifndef NDEBUG
                candidate_pivot_value = fabs(mc_value[ifind]);
#endif
                merit_pivot = merit_local;
                jColPivot = j;
                iRowPivot = i;
                foundPivot = foundPivot || (column_count <= count);
              }
            }
          }
          if (searchCount++ >= searchLimit && merit_pivot < merit_limit)
            foundPivot = true;
          if (foundPivot) break;
        }

        fake_search += count;
      }
    }
    // 1.4. If we found nothing: tell singular
    if (iRowPivot < 0) {
      // To detect the absence of a pivot, it should be sufficient
      // that iRowPivot is (still) -1, but add sanity asserts that
      // jColPivot is (still) -1 and foundPivot is false
      assert(jColPivot < 0);
      assert(!foundPivot);
      rank_deficiency = nwork + 1;
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Factorization identifies rank deficiency of %d\n",
                  (int)rank_deficiency);
      return rank_deficiency;
    }

    /**
     * 2. Elimination other elements by the pivot
     */
#ifndef NDEBUG
    const HighsInt original_pivotal_row_count = mr_count[iRowPivot];
    const HighsInt original_pivotal_col_count = mc_count_a[jColPivot];
#endif
    // 2.1. Delete the pivot
    //
    // Remove the pivot row index from the pivotal column of the
    // col-wise matrix. Also decreases the column count
    double pivot_multiplier = colDelete(jColPivot, iRowPivot);
    // Remove the pivot column index from the pivotal row of the
    // row-wise matrix. Also decreases the row count
    rowDelete(jColPivot, iRowPivot);
    // Remove the pivotal column from the linked list of columns
    // containing it
    clinkDel(jColPivot);
    // Remove the pivotal row from the linked list of rows containing
    // it
    rlinkDel(iRowPivot);
    if (!singleton_pivot)
      assert(candidate_pivot_value == fabs(pivot_multiplier));
    if (fabs(pivot_multiplier) < pivot_tolerance) {
      highsLogDev(log_options, HighsLogType::kWarning,
                  "Defer singular pivot = %11.4g\n", pivot_multiplier);
      // Matrix is singular, but defer return since other valid pivots
      // may exist.
      assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
      if (mr_count[iRowPivot] == 0) {
        // The pivot corresponds to a singleton row. Entry is zeroed,
        // and do no more since there may be other valid entries in
        // the pivotal column
        //
        // Add the pivotal column to the linked list of columns with
        // its new count
        assert(mc_count_a[jColPivot] == original_pivotal_col_count - 1);
        clinkAdd(jColPivot, mc_count_a[jColPivot]);
      } else {
        // Otherwise, other entries in the pivotal column will be
        // smaller than the pivot, so zero the column
        zeroCol(jColPivot);
        // Add the pivotal row to the linked list of rows with its new
        // count
        assert(mr_count[iRowPivot] == original_pivotal_row_count - 1);
        rlinkAdd(iRowPivot, mr_count[iRowPivot]);
      }
      // No pivot found, so have to increment nwork
      nwork++;
      continue;
    }
    permute[jColPivot] = iRowPivot;
    assert(mc_var[jColPivot] == basic_index[jColPivot]);

    this->refactor_info_.pivot_row.push_back(iRowPivot);
    this->refactor_info_.pivot_var.push_back(basic_index[jColPivot]);
    this->refactor_info_.pivot_type.push_back(kPivotMarkowitz);

    // 2.2. Store active pivot column to L
    HighsInt start_A = mc_start[jColPivot];
    HighsInt end_A = start_A + mc_count_a[jColPivot];
    HighsInt mwz_column_count = 0;
    for (HighsInt k = start_A; k < end_A; k++) {
      const HighsInt iRow = mc_index[k];
      const double value = mc_value[k] / pivot_multiplier;
      mwz_column_index[mwz_column_count++] = iRow;
      mwz_column_array[iRow] = value;
      mwz_column_mark[iRow] = 1;
      l_index.push_back(iRow);
      l_value.push_back(value);
      mr_count_before[iRow] = mr_count[iRow];
      rowDelete(jColPivot, (int)iRow);
    }
    l_start.push_back(l_index.size());
    fake_fill += 2 * mc_count_a[jColPivot];

    // 2.3. Store non active pivot column to U
    HighsInt end_N = start_A + mc_space[jColPivot];
    HighsInt start_N = end_N - mc_count_n[jColPivot];
    for (HighsInt i = start_N; i < end_N; i++) {
      u_index.push_back(mc_index[i]);
      u_value.push_back(mc_value[i]);
    }
    u_pivot_index.push_back(iRowPivot);
    u_pivot_value.push_back(pivot_multiplier);
    u_start.push_back(u_index.size());
    fake_fill += end_N - start_N;

    // 2.4. Loop over pivot row to eliminate other column
    const HighsInt row_start = mr_start[iRowPivot];
    const HighsInt row_end = row_start + mr_count[iRowPivot];
    for (HighsInt row_k = row_start; row_k < row_end; row_k++) {
      // 2.4.1. My pointer
      HighsInt iCol = mr_index[row_k];
      const HighsInt my_count = mc_count_a[iCol];
      const HighsInt my_start = mc_start[iCol];
      const HighsInt my_end = my_start + my_count - 1;
      double my_pivot = colDelete(iCol, iRowPivot);
      colStoreN(iCol, iRowPivot, my_pivot);

      // 2.4.2. Elimination on the overlapping part
      HighsInt nFillin = mwz_column_count;
      HighsInt nCancel = 0;
      for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
        HighsInt iRow = mc_index[my_k];
        double value = mc_value[my_k];
        if (mwz_column_mark[iRow]) {
          mwz_column_mark[iRow] = 0;
          nFillin--;
          value -= my_pivot * mwz_column_array[iRow];
          if (fabs(value) < kHighsTiny) {
            value = 0;
            nCancel++;
          }
          mc_value[my_k] = value;
        }
      }
      fake_eliminate += mwz_column_count;
      fake_eliminate += nFillin * 2;

      // 2.4.3. Remove cancellation gaps
      if (nCancel > 0) {
        HighsInt new_end = my_start;
        for (HighsInt my_k = my_start; my_k < my_end; my_k++) {
          if (mc_value[my_k] != 0) {
            mc_index[new_end] = mc_index[my_k];
            mc_value[new_end++] = mc_value[my_k];
          } else {
            rowDelete(iCol, mc_index[my_k]);
          }
        }
        mc_count_a[iCol] = new_end - my_start;
      }

      // 2.4.4. Insert fill-in
      if (nFillin > 0) {
        // 2.4.4.1 Check column size
        if (mc_count_a[iCol] + mc_count_n[iCol] + nFillin > mc_space[iCol]) {
          // p1&2=active, p3&4=non active, p5=new p1, p7=new p3
          HighsInt p1 = mc_start[iCol];
          HighsInt p2 = p1 + mc_count_a[iCol];
          HighsInt p3 = p1 + mc_space[iCol] - mc_count_n[iCol];
          HighsInt p4 = p1 + mc_space[iCol];
          mc_space[iCol] += max(mc_space[iCol], nFillin);
          HighsInt p5 = mc_start[iCol] = mc_index.size();
          HighsInt p7 = p5 + mc_space[iCol] - mc_count_n[iCol];
          mc_index.resize(p5 + mc_space[iCol]);
          mc_value.resize(p5 + mc_space[iCol]);
          copy(&mc_index[p1], &mc_index[p2], &mc_index[p5]);
          copy(&mc_value[p1], &mc_value[p2], &mc_value[p5]);
          copy(&mc_index[p3], &mc_index[p4], &mc_index[p7]);
          copy(&mc_value[p3], &mc_value[p4], &mc_value[p7]);
        }

        // 2.4.4.2 Fill into column copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow])
            colInsert(iCol, iRow, -my_pivot * mwz_column_array[iRow]);
        }

        // 2.4.4.3 Fill into the row copy
        for (HighsInt i = 0; i < mwz_column_count; i++) {
          HighsInt iRow = mwz_column_index[i];
          if (mwz_column_mark[iRow]) {
            // Expand row space
            if (mr_count[iRow] == mr_space[iRow]) {
              HighsInt p1 = mr_start[iRow];
              HighsInt p2 = p1 + mr_count[iRow];
              HighsInt p3 = mr_start[iRow] = mr_index.size();
              mr_space[iRow] *= 2;
              mr_index.resize(p3 + mr_space[iRow]);
              copy(&mr_index[p1], &mr_index[p2], &mr_index[p3]);
            }
            rowInsert(iCol, iRow);
          }
        }
      }

      // 2.4.5. Reset pivot column mark
      for (HighsInt i = 0; i < mwz_column_count; i++)
        mwz_column_mark[mwz_column_index[i]] = 1;

      // 2.4.6. Fix max value and link list
      colFixMax(iCol);
      if (my_count != mc_count_a[iCol]) {
        clinkDel(iCol);
        clinkAdd(iCol, mc_count_a[iCol]);
      }
    }

    // 2.5. Clear pivot column buffer
    for (HighsInt i = 0; i < mwz_column_count; i++)
      mwz_column_mark[mwz_column_index[i]] = 0;

    // 2.6. Correct row links for the remain active part
    for (HighsInt i = start_A; i < end_A; i++) {
      HighsInt iRow = mc_index[i];
      if (mr_count_before[iRow] != mr_count[iRow]) {
        rlinkDel(iRow);
        rlinkAdd(iRow, mr_count[iRow]);
      }
    }
  }
  build_synthetic_tick +=
      fake_search * 20 + fake_fill * 160 + fake_eliminate * 80;
  rank_deficiency = 0;
  return rank_deficiency;
}